

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_set_subject(PROPERTIES_HANDLE properties,char *subject_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE subject_amqp_value;
  PROPERTIES_INSTANCE *properties_instance;
  int result;
  char *subject_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x3fc9;
  }
  else {
    item_value = amqpvalue_create_string(subject_value);
    if (item_value == (AMQP_VALUE)0x0) {
      properties_instance._4_4_ = 0x3fd1;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,3,item_value);
      if (iVar1 == 0) {
        properties_instance._4_4_ = 0;
      }
      else {
        properties_instance._4_4_ = 0x3fd7;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_set_subject(PROPERTIES_HANDLE properties, const char* subject_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE subject_amqp_value = amqpvalue_create_string(subject_value);
        if (subject_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 3, subject_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(subject_amqp_value);
        }
    }

    return result;
}